

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int newDatabase(BtShared *pBt)

{
  char *pcVar1;
  MemPage *in_RDI;
  int rc;
  uchar *data;
  MemPage *pP1;
  undefined4 in_stack_ffffffffffffffd8;
  long lVar2;
  int local_4;
  int flags;
  
  if (*(int *)(in_RDI->apOvfl + 3) == 0) {
    lVar2 = *(long *)&in_RDI->nCell;
    pcVar1 = *(char **)(lVar2 + 0x50);
    local_4 = sqlite3PagerWrite((PgHdr *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd8));
    flags = (int)((ulong)lVar2 >> 0x20);
    if (local_4 == 0) {
      pcVar1[0] = 'S';
      pcVar1[1] = 'Q';
      pcVar1[2] = 'L';
      pcVar1[3] = 'i';
      pcVar1[4] = 't';
      pcVar1[5] = 'e';
      pcVar1[6] = ' ';
      pcVar1[7] = 'f';
      pcVar1[8] = 'o';
      pcVar1[9] = 'r';
      pcVar1[10] = 'm';
      pcVar1[0xb] = 'a';
      pcVar1[0xc] = 't';
      pcVar1[0xd] = ' ';
      pcVar1[0xe] = '3';
      pcVar1[0xf] = '\0';
      pcVar1[0x10] = (char)((uint)*(undefined4 *)((long)in_RDI->apOvfl + 0xc) >> 8);
      pcVar1[0x11] = (char)((uint)*(undefined4 *)((long)in_RDI->apOvfl + 0xc) >> 0x10);
      pcVar1[0x12] = '\x01';
      pcVar1[0x13] = '\x01';
      pcVar1[0x14] = (char)*(undefined4 *)((long)in_RDI->apOvfl + 0xc) -
                     (char)*(undefined4 *)(in_RDI->apOvfl + 2);
      pcVar1[0x15] = '@';
      pcVar1[0x16] = ' ';
      pcVar1[0x17] = ' ';
      memset(pcVar1 + 0x18,0,0x4c);
      zeroPage(in_RDI,flags);
      *(ushort *)in_RDI->apOvfl = *(ushort *)in_RDI->apOvfl | 2;
      sqlite3Put4byte((uchar *)(pcVar1 + 0x34),(uint)*(byte *)((long)in_RDI->aiOvfl + 5));
      sqlite3Put4byte((uchar *)(pcVar1 + 0x40),(uint)(byte)in_RDI->aiOvfl[3]);
      *(undefined4 *)(in_RDI->apOvfl + 3) = 1;
      pcVar1[0x1f] = '\x01';
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int newDatabase(BtShared *pBt){
  MemPage *pP1;
  unsigned char *data;
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->nPage>0 ){
    return SQLITE_OK;
  }
  pP1 = pBt->pPage1;
  assert( pP1!=0 );
  data = pP1->aData;
  rc = sqlite3PagerWrite(pP1->pDbPage);
  if( rc ) return rc;
  memcpy(data, zMagicHeader, sizeof(zMagicHeader));
  assert( sizeof(zMagicHeader)==16 );
  data[16] = (u8)((pBt->pageSize>>8)&0xff);
  data[17] = (u8)((pBt->pageSize>>16)&0xff);
  data[18] = 1;
  data[19] = 1;
  assert( pBt->usableSize<=pBt->pageSize && pBt->usableSize+255>=pBt->pageSize);
  data[20] = (u8)(pBt->pageSize - pBt->usableSize);
  data[21] = 64;
  data[22] = 32;
  data[23] = 32;
  memset(&data[24], 0, 100-24);
  zeroPage(pP1, PTF_INTKEY|PTF_LEAF|PTF_LEAFDATA );
  pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
  assert( pBt->autoVacuum==1 || pBt->autoVacuum==0 );
  assert( pBt->incrVacuum==1 || pBt->incrVacuum==0 );
  put4byte(&data[36 + 4*4], pBt->autoVacuum);
  put4byte(&data[36 + 7*4], pBt->incrVacuum);
#endif
  pBt->nPage = 1;
  data[31] = 1;
  return SQLITE_OK;
}